

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O3

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
 __thiscall
draco::MeshPredictionSchemeDecoderFactory<int>::
DispatchFunctor<draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>,_(draco::PredictionSchemeTransformType)1>
::operator()(DispatchFunctor<draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>,_(draco::PredictionSchemeTransformType)1>
             *this,PredictionSchemeMethod method,PointAttribute *attribute,
            PredictionSchemeWrapDecodingTransform<int,_int> *transform,
            MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data,
            uint16_t bitstream_version)

{
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data_00;
  CornerTable *pCVar1;
  Mesh *pMVar2;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *pvVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  undefined **ppuVar5;
  MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *this_00;
  undefined6 in_register_0000008a;
  ushort in_stack_00000008;
  
  if (5 < (int)attribute - 1U) {
    this_00 = (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               *)0x0;
    goto LAB_00148753;
  }
  mesh_data_00 = (MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *)
                 CONCAT62(in_register_0000008a,bitstream_version);
  switch((int)attribute) {
  case 1:
    this_00 = (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               *)operator_new(0x60);
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
    super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
         (_func_int **)&PTR__PredictionSchemeDecoder_00180c28;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    attribute_ = (PointAttribute *)transform;
    pCVar1 = mesh_data->corner_table_;
    *(Mesh **)&(this_00->
               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               ).
               super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               .transform_.super_PredictionSchemeWrapTransformBase<int> = mesh_data->mesh_;
    *(CornerTable **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ = pCVar1;
    *(vector<int,_std::allocator<int>_> **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_correction_ =
         mesh_data->vertex_to_data_map_;
    std::vector<int,_std::allocator<int>_>::vector
              (&(this_00->
                super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                ).
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                .transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_,
               (vector<int,_std::allocator<int>_> *)&mesh_data->data_to_corner_map_);
    pMVar2 = mesh_data_00->mesh_;
    pCVar1 = mesh_data_00->corner_table_;
    pvVar3 = mesh_data_00->data_to_corner_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.vertex_to_data_map_ = mesh_data_00->vertex_to_data_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.data_to_corner_map_ = pvVar3;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.mesh_ = pMVar2;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.corner_table_ = pCVar1;
    ppuVar5 = &PTR__PredictionSchemeDecoder_00180ac0;
    goto LAB_0014872b;
  case 2:
    this_00 = (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               *)operator_new(0x60);
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
    super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
         (_func_int **)&PTR__PredictionSchemeDecoder_00180c28;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    attribute_ = (PointAttribute *)transform;
    pCVar1 = mesh_data->corner_table_;
    *(Mesh **)&(this_00->
               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               ).
               super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               .transform_.super_PredictionSchemeWrapTransformBase<int> = mesh_data->mesh_;
    *(CornerTable **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ = pCVar1;
    *(vector<int,_std::allocator<int>_> **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_correction_ =
         mesh_data->vertex_to_data_map_;
    std::vector<int,_std::allocator<int>_>::vector
              (&(this_00->
                super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                ).
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                .transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_,
               (vector<int,_std::allocator<int>_> *)&mesh_data->data_to_corner_map_);
    pMVar2 = mesh_data_00->mesh_;
    pCVar1 = mesh_data_00->corner_table_;
    pvVar3 = mesh_data_00->data_to_corner_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.vertex_to_data_map_ = mesh_data_00->vertex_to_data_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.data_to_corner_map_ = pvVar3;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.mesh_ = pMVar2;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.corner_table_ = pCVar1;
    ppuVar5 = &PTR__PredictionSchemeDecoder_00180c98;
LAB_0014872b:
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
    super_PredictionSchemeInterface._vptr_PredictionSchemeInterface = (_func_int **)ppuVar5;
    break;
  case 3:
    this_00 = (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               *)operator_new(0xb0);
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
    super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
         (_func_int **)&PTR__PredictionSchemeDecoder_00180c28;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    attribute_ = (PointAttribute *)transform;
    pCVar1 = mesh_data->corner_table_;
    *(Mesh **)&(this_00->
               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               ).
               super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               .transform_.super_PredictionSchemeWrapTransformBase<int> = mesh_data->mesh_;
    *(CornerTable **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ = pCVar1;
    *(vector<int,_std::allocator<int>_> **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_correction_ =
         mesh_data->vertex_to_data_map_;
    std::vector<int,_std::allocator<int>_>::vector
              (&(this_00->
                super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                ).
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                .transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_,
               (vector<int,_std::allocator<int>_> *)&mesh_data->data_to_corner_map_);
    pMVar2 = mesh_data_00->mesh_;
    pCVar1 = mesh_data_00->corner_table_;
    pvVar3 = mesh_data_00->data_to_corner_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.vertex_to_data_map_ = mesh_data_00->vertex_to_data_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.data_to_corner_map_ = pvVar3;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.mesh_ = pMVar2;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.corner_table_ = pCVar1;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
    super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
         (_func_int **)&PTR__MeshPredictionSchemeTexCoordsDecoder_00180da8;
    this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    *(undefined4 *)
     &this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = 0;
    *(undefined8 *)
     &this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    *(undefined4 *)
     &this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = 0;
    *(undefined8 *)
     &this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    *(undefined8 *)
     &this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base.field_0xc = 0;
    *(undefined8 *)
     ((long)&this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 4) = 0;
    *(uint *)&this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (uint)in_stack_00000008;
    break;
  case 4:
    this_00 = (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               *)operator_new(0x108);
    MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ::MeshPredictionSchemeConstrainedMultiParallelogramDecoder
              (this_00,(PointAttribute *)transform,
               (PredictionSchemeWrapDecodingTransform<int,_int> *)mesh_data,mesh_data_00);
    break;
  case 5:
    this_00 = (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               *)operator_new(0xc0);
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
    super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
         (_func_int **)&PTR__PredictionSchemeDecoder_00180c28;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    attribute_ = (PointAttribute *)transform;
    pCVar1 = mesh_data->corner_table_;
    *(Mesh **)&(this_00->
               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               ).
               super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               .transform_.super_PredictionSchemeWrapTransformBase<int> = mesh_data->mesh_;
    *(CornerTable **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ = pCVar1;
    *(vector<int,_std::allocator<int>_> **)
     &(this_00->
      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
      ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
      transform_.super_PredictionSchemeWrapTransformBase<int>.max_correction_ =
         mesh_data->vertex_to_data_map_;
    std::vector<int,_std::allocator<int>_>::vector
              (&(this_00->
                super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                ).
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                .transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_,
               (vector<int,_std::allocator<int>_> *)&mesh_data->data_to_corner_map_);
    pMVar2 = mesh_data_00->mesh_;
    pCVar1 = mesh_data_00->corner_table_;
    pvVar3 = mesh_data_00->data_to_corner_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.vertex_to_data_map_ = mesh_data_00->vertex_to_data_map_;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.data_to_corner_map_ = pvVar3;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.mesh_ = pMVar2;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).mesh_data_.corner_table_ = pCVar1;
    (this_00->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
    super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
         (_func_int **)&PTR__MeshPredictionSchemeTexCoordsPortableDecoder_00180e30;
    *(undefined8 *)
     &this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    *(undefined4 *)
     &this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = 0;
    this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &this_00->is_crease_edge_[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    pCVar1 = mesh_data_00->corner_table_;
    pvVar4 = mesh_data_00->vertex_to_data_map_;
    pvVar3 = mesh_data_00->data_to_corner_map_;
    *(Mesh **)&this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
         mesh_data_00->mesh_;
    this_00->is_crease_edge_[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)pCVar1;
    this_00->is_crease_edge_[2].super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pvVar4;
    *(vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      **)&this_00->is_crease_edge_[2].super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = pvVar3;
    break;
  case 6:
    this_00 = (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
               *)operator_new(0xd0);
    MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ::MeshPredictionSchemeGeometricNormalDecoder
              ((MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                *)this_00,(PointAttribute *)transform,
               (PredictionSchemeWrapDecodingTransform<int,_int> *)mesh_data,mesh_data_00);
  }
LAB_00148753:
  *(MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    **)this = this_00;
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>> operator()(
        PredictionSchemeMethod method, const PointAttribute *attribute,
        const TransformT &transform, const MeshDataT &mesh_data,
        uint16_t bitstream_version) {
      if (method == MESH_PREDICTION_PARALLELOGRAM) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeParallelogramDecoder<DataTypeT, TransformT,
                                                         MeshDataT>(
                attribute, transform, mesh_data));
      }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      else if (method == MESH_PREDICTION_MULTI_PARALLELOGRAM) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeMultiParallelogramDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#endif
      else if (method == MESH_PREDICTION_CONSTRAINED_MULTI_PARALLELOGRAM) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeConstrainedMultiParallelogramDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      else if (method == MESH_PREDICTION_TEX_COORDS_DEPRECATED) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT,
                                                     MeshDataT>(
                attribute, transform, mesh_data, bitstream_version));
      }
#endif
      else if (method == MESH_PREDICTION_TEX_COORDS_PORTABLE) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeTexCoordsPortableDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#ifdef DRACO_NORMAL_ENCODING_SUPPORTED
      else if (method == MESH_PREDICTION_GEOMETRIC_NORMAL) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeGeometricNormalDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#endif
      return nullptr;
    }